

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

uint64_t __thiscall pstore::file::file_handle::tell(file_handle *this)

{
  int err;
  pointer pcVar1;
  uint64_t uVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->file_ == -1) {
    raise<std::errc>(bad_file_descriptor);
  }
  uVar2 = lseek(this->file_,0,1);
  if (uVar2 != 0xffffffffffffffff) {
    if (-1 < (long)uVar2) {
      return uVar2;
    }
    assert_failed("r >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                  ,0x11f);
  }
  piVar3 = __errno_location();
  err = *piVar3;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->path_)._M_string_length);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (err,"lseek/SEEK_CUR failed",&local_38);
}

Assistant:

std::uint64_t file_handle::tell () {
            this->ensure_open ();

            off_t const r = ::lseek (file_, off_t{0}, SEEK_CUR);
            if (r == off_t{-1}) {
                int const err = errno;
                raise_file_error (err, "lseek/SEEK_CUR failed", this->path ());
            }
            PSTORE_ASSERT (r >= 0);
            return static_cast<std::uint64_t> (r);
        }